

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_ins_var_nentry_test(void)

{
  uint64_t uVar1;
  int iVar2;
  size_t sVar3;
  bnode *__ptr;
  char *pcVar4;
  long lVar5;
  char cVar6;
  btree_kv_ops local_c8;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  timeval __test_begin;
  undefined1 local_30 [15];
  char local_21 [8];
  uint8_t v;
  
  uStack_50 = 0x1027e9;
  gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
  uStack_50 = 0x1027ee;
  memleak_start();
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 8) {
    pcVar4 = *(char **)((long)&DAT_00108d60 + lVar5);
    uStack_50 = 0x102807;
    sVar3 = strlen(pcVar4);
    uStack_50 = 0x10281c;
    construct_key_ptr(pcVar4,(short)sVar3 + 1,local_30 + lVar5 + -8);
  }
  uStack_50 = 0x10282f;
  __ptr = dummy_node('\t','\x01',1);
  __ptr->nentry = 2;
  local_21[0] = 'd';
  btree_str_kv_get_kb64_vb64(&local_c8);
  (*local_c8.ins_kv)(__ptr,0,&__test_begin.tv_usec,local_21);
  local_21[0] = local_21[0] + '\x01';
  (*local_c8.ins_kv)(__ptr,0,local_30,local_21);
  uVar1 = (__ptr->field_4).dummy;
  iVar2 = strcmp((char *)(uVar1 + 2),"longstring");
  if (iVar2 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x285);
    kv_ins_var_nentry_test()::__test_pass = 1;
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x285,"void kv_ins_var_nentry_test()");
  }
  if (*(char *)(uVar1 + 0xd) != local_21[0]) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x288);
    kv_ins_var_nentry_test()::__test_pass = 1;
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x288,"void kv_ins_var_nentry_test()");
  }
  cVar6 = *(char *)(uVar1 + 0xd) + -1;
  local_21[0] = cVar6;
  iVar2 = strcmp((char *)(uVar1 + 0x10),"string");
  if (iVar2 == 0) {
    if (*(char *)(uVar1 + 0x17) == cVar6) {
      free(__ptr);
      freevars((void **)&__test_begin.tv_usec,2);
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (kv_ins_var_nentry_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar4,"kv_ins_var_nentry_test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x292);
    kv_ins_var_nentry_test()::__test_pass = 1;
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x292,"void kv_ins_var_nentry_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
          ,0x28f);
  kv_ins_var_nentry_test()::__test_pass = 1;
  __assert_fail("cmp == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                ,0x28f,"void kv_ins_var_nentry_test()");
}

Assistant:

void kv_ins_var_nentry_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    idx_t idx;
    int cmp, i, offset;
    char *node_str;

    const char *keys[] = {"string",
                          "longstring"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    idx = 0;
    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // insert twice at beginning of node
    kv_ops->ins_kv(node, 0, &key_ptrs[idx], (void *)&v);
    idx++;
    v++;
    kv_ops->ins_kv(node, 0, &key_ptrs[idx], (void *)&(v));

    // verify k1 is at entry 0
    offset = sizeof(key_len_t);
    node_str = (char *)((uint8_t *)node->data + offset);
    cmp = strcmp(node_str, keys[1]);
    TEST_CHK(cmp == 0);
    offset += strlen(keys[1]) + 1;
    cmp = memcmp((uint8_t *)node->data + offset, &v, vsize);
    TEST_CHK(cmp == 0);

    v--;
    // verify k0 is at entry 1
    offset += vsize + sizeof(key_len_t);
    node_str = (char *)((uint8_t *)node->data + offset);
    cmp = strcmp(node_str, keys[0]);
    TEST_CHK(cmp == 0);
    offset += strlen(keys[0]) + 1;
    cmp = memcmp((uint8_t *)node->data + offset, &v, vsize);
    TEST_CHK(cmp == 0);

    free(node);
    freevars(key_ptrs, n);
    memleak_end();

    TEST_RESULT("kv_ins_var_nentry_test");
}